

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

size_t __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
try_dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
          (ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
           *this,__normal_iterator<duckdb::BufferEvictionNode_*,_std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>_>
                 itemFirst,size_t max)

{
  ExplicitProducer *pEVar1;
  size_t sVar2;
  size_t sVar3;
  ExplicitProducer *this_00;
  __normal_iterator<duckdb::BufferEvictionNode_*,_std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>_>
  local_28;
  
  this_00 = *(ExplicitProducer **)this;
  if (this_00 == (ExplicitProducer *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    local_28._M_current = itemFirst._M_current;
    do {
      if (this_00[0x48] == (ExplicitProducer)0x1) {
        sVar2 = ExplicitProducer::
                dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
                          (this_00,&local_28,max - sVar3);
      }
      else {
        sVar2 = ImplicitProducer::
                dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
                          ((ImplicitProducer *)this_00,&local_28,max - sVar3);
      }
      sVar3 = sVar3 + sVar2;
    } while ((sVar3 != max) &&
            (pEVar1 = this_00 + 8, this_00 = (ExplicitProducer *)(*(long *)pEVar1 + -8),
            *(long *)pEVar1 != 0));
  }
  return sVar3;
}

Assistant:

size_t try_dequeue_bulk(It itemFirst, size_t max)
	{
		size_t count = 0;
		for (auto ptr = producerListTail.load(std::memory_order_acquire); ptr != nullptr; ptr = ptr->next_prod()) {
			count += ptr->dequeue_bulk(itemFirst, max - count);
			if (count == max) {
				break;
			}
		}
		return count;
	}